

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
MCTS::compute_tree<NimState>(TestGame root_state,ComputeOptions options,result_type initial_seed)

{
  pointer piVar1;
  pointer piVar2;
  undefined4 *puVar3;
  Node<NimState> *this;
  runtime_error *this_00;
  long lVar4;
  __uniq_ptr_data<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>,_true,_true>
  _Var5;
  result_type rVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  mt19937_64 random_engine;
  undefined1 local_a10 [8];
  TestGame local_a08;
  Move local_9fc;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  local_a08.winner = (int)((ulong)register0x00000030 >> 0x20);
  local_a08.player_to_move = root_state.X;
  _Var5.super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>.
  _M_t.super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>.
  super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl = root_state._0_8_;
  lVar4 = 1;
  rVar6 = initial_seed;
  do {
    rVar6 = (rVar6 >> 0x3e ^ rVar6) * 0x5851f42d4c957f2d + lVar4;
    local_9f8._M_x[lVar4] = rVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x138);
  local_9f8._M_p = 0x138;
  local_9f8._M_x[0] = initial_seed;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < local_a08.player_to_move - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  puVar3 = (undefined4 *)operator_new(0x60);
  *puVar3 = 0xffffffff;
  *(undefined8 *)(puVar3 + 2) = 0;
  puVar3[4] = local_a08.player_to_move;
  *(undefined8 *)(puVar3 + 6) = 0;
  puVar3[8] = 0;
  NimState::get_moves((vector<int,_std::allocator<int>_> *)(puVar3 + 10),(NimState *)(local_a10 + 8)
                     );
  *(undefined8 *)(puVar3 + 0x14) = 0;
  *(undefined8 *)(puVar3 + 0x16) = 0;
  *(undefined8 *)(puVar3 + 0x10) = 0;
  *(undefined8 *)(puVar3 + 0x12) = 0;
  *(undefined4 **)
   _Var5.super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>.
   _M_t.super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>.
   super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl = puVar3;
  if (options.max_iterations != 0) {
    iVar7 = 1;
    do {
      this = *(Node<NimState> **)
              _Var5.
              super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
              .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
      local_a10._0_4_ = local_a08.player_to_move;
      local_a10._4_4_ = local_a08.winner;
      while( true ) {
        piVar1 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar1 != piVar2) break;
        if ((this->children).
            super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->children).
            super__Vector_base<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (piVar1 == piVar2) goto LAB_0014ae09;
          break;
        }
        this = Node<NimState>::select_child_UCT(this);
        NimState::do_move((NimState *)local_a10,this->move);
      }
      local_9fc = Node<NimState>::
                  get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (this,&local_9f8);
      NimState::do_move((NimState *)local_a10,local_9fc);
      this = Node<NimState>::add_child(this,&local_9fc,(TestGame *)local_a10);
LAB_0014ae09:
      while( true ) {
        NimState::check_invariant((NimState *)local_a10);
        if ((int)local_a10._4_4_ < 1) break;
        NimState::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  ((NimState *)local_a10,&local_9f8);
      }
      for (; this != (Node<NimState> *)0x0; this = this->parent) {
        dVar9 = NimState::get_result((NimState *)local_a10,this->player_to_move);
        this->visits = this->visits + 1;
        this->wins = dVar9 + this->wins;
      }
      bVar8 = iVar7 != options.max_iterations;
      iVar7 = iVar7 + 1;
    } while (bVar8);
  }
  return (__uniq_ptr_data<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>,_true,_true>
          )(tuple<MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>)
           _Var5.
           super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>.
           _M_t.
           super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
           .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}